

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ParseHexUV(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,UniValue *v
          ,string *strName)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  string_view str;
  string_view hex_str;
  string strHex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_30;
  
  local_30 = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  paVar3 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar3;
  if (v->typ == VSTR) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_50,&v->val);
  }
  str._M_str = local_50._M_dataplus._M_p;
  str._M_len = local_50._M_string_length;
  bVar1 = IsHex(str);
  if (bVar1) {
    hex_str._M_str = local_50._M_dataplus._M_p;
    hex_str._M_len = local_50._M_string_length;
    ParseHex<unsigned_char>(__return_storage_ptr__,hex_str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) == local_30
       ) {
      return *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,strName," must be hexadecimal string (not \'");
    std::operator+(&local_90,&local_b0,&local_50);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,"\')");
    local_70 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70 == paVar3) {
      local_60 = paVar3->_M_allocated_capacity;
      uStack_58 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_70 = &local_60;
    }
    else {
      local_60 = paVar3->_M_allocated_capacity;
    }
    local_68 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this,(string *)&local_70);
    if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) == local_30
       ) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<unsigned char> ParseHexUV(const UniValue& v, const std::string& strName)
{
    std::string strHex;
    if (v.isStr())
        strHex = v.getValStr();
    if (!IsHex(strHex))
        throw std::runtime_error(strName + " must be hexadecimal string (not '" + strHex + "')");
    return ParseHex(strHex);
}